

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__hdr_info(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char buffer [1024];
  char *local_448;
  int *local_440;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  iVar2 = stbi__hdr_test(s);
  if (iVar2 != 0) {
    local_440 = x;
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar1 = false;
      do {
        auVar5[0] = -(cStack_431 == '3');
        auVar5[1] = -(cStack_430 == '2');
        auVar5[2] = -(cStack_42f == '-');
        auVar5[3] = -(cStack_42e == 'b');
        auVar5[4] = -(cStack_42d == 'i');
        auVar5[5] = -(cStack_42c == 't');
        auVar5[6] = -(cStack_42b == '_');
        auVar5[7] = -(cStack_42a == 'r');
        auVar5[8] = -(cStack_429 == 'l');
        auVar5[9] = -(cStack_428 == 'e');
        auVar5[10] = -(cStack_427 == '_');
        auVar5[0xb] = -(cStack_426 == 'r');
        auVar5[0xc] = -(cStack_425 == 'g');
        auVar5[0xd] = -(cStack_424 == 'b');
        auVar5[0xe] = -(cStack_423 == 'e');
        auVar5[0xf] = -(cStack_422 == '\0');
        auVar6[0] = -(local_438 == 'F');
        auVar6[1] = -(cStack_437 == 'O');
        auVar6[2] = -(cStack_436 == 'R');
        auVar6[3] = -(cStack_435 == 'M');
        auVar6[4] = -(cStack_434 == 'A');
        auVar6[5] = -(cStack_433 == 'T');
        auVar6[6] = -(cStack_432 == '=');
        auVar6[7] = -(cStack_431 == '3');
        auVar6[8] = -(cStack_430 == '2');
        auVar6[9] = -(cStack_42f == '-');
        auVar6[10] = -(cStack_42e == 'b');
        auVar6[0xb] = -(cStack_42d == 'i');
        auVar6[0xc] = -(cStack_42c == 't');
        auVar6[0xd] = -(cStack_42b == '_');
        auVar6[0xe] = -(cStack_42a == 'r');
        auVar6[0xf] = -(cStack_429 == 'l');
        auVar6 = auVar6 & auVar5;
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar1) {
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && (short)_local_438 == 0x592d) {
          local_448 = &cStack_435;
          lVar3 = strtol(local_448,&local_448,10);
          if (y != (int *)0x0) {
            *y = (int)lVar3;
          }
          local_448 = local_448 + 2;
          do {
            pcVar4 = local_448;
            local_448 = pcVar4 + 1;
          } while (pcVar4[-2] == ' ');
          if (((pcVar4[-2] == '+') && (pcVar4[-1] == 'X')) && (*pcVar4 == ' ')) {
            lVar3 = strtol(local_448,(char **)0x0,10);
            if (local_440 != (int *)0x0) {
              *local_440 = (int)lVar3;
            }
            if (comp == (int *)0x0) {
              return 1;
            }
            *comp = 3;
            return 1;
          }
        }
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__hdr_info(stbi__context* s, int* x, int* y, int* comp)
{
    char buffer[STBI__HDR_BUFLEN];
    char* token;
    int valid = 0;
    int dummy;

    if (!x)
        x = &dummy;
    if (!y)
        y = &dummy;
    if (!comp)
        comp = &dummy;

    if (stbi__hdr_test(s) == 0) {
        stbi__rewind(s);
        return 0;
    }

    for (;;) {
        token = stbi__hdr_gettoken(s, buffer);
        if (token[0] == 0)
            break;
        if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0)
            valid = 1;
    }

    if (!valid) {
        stbi__rewind(s);
        return 0;
    }
    token = stbi__hdr_gettoken(s, buffer);
    if (strncmp(token, "-Y ", 3)) {
        stbi__rewind(s);
        return 0;
    }
    token += 3;
    *y = (int)strtol(token, &token, 10);
    while (*token == ' ')
        ++token;
    if (strncmp(token, "+X ", 3)) {
        stbi__rewind(s);
        return 0;
    }
    token += 3;
    *x = (int)strtol(token, NULL, 10);
    *comp = 3;
    return 1;
}